

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O2

PropertyDefinition * __thiscall
Rml::PropertyDefinition::AddParser
          (PropertyDefinition *this,String *parser_name,String *parser_parameters)

{
  Property *this_00;
  pointer pPVar1;
  pointer pPVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  type piVar7;
  pointer pbVar8;
  int parameter_value;
  PropertyDefinition *local_d0;
  StringList parameter_list;
  String unparsed_value;
  ParserState new_parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  new_parser.parameters.mKeyVals = (Node *)&new_parser.parameters.mMask;
  new_parser.parameters.mNumElements = 0;
  new_parser.parameters.mMask = 0;
  new_parser.parameters.mMaxNumElementsAllowed = 0;
  new_parser.parameters.mInfoInc = 0x20;
  new_parser.parameters.mInfoHashShift = 0;
  new_parser.parameters.mInfo = (uint8_t *)new_parser.parameters.mKeyVals;
  new_parser.parser = StyleSheetSpecification::GetParser(parser_name);
  if (new_parser.parser == (PropertyParser *)0x0) {
    Log::Message(LT_ERROR,"Property was registered with invalid parser \'%s\'.",
                 (parser_name->_M_dataplus)._M_p);
  }
  else {
    if (parser_parameters->_M_string_length != 0) {
      parameter_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parameter_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parameter_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0 = this;
      StringUtilities::ExpandString(&parameter_list,parser_parameters,',');
      pbVar3 = parameter_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      parameter_value = 0;
      for (pbVar8 = parameter_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1
          ) {
        lVar6 = ::std::__cxx11::string::find((char)pbVar8,0x3d);
        if (lVar6 != -1) {
          ::std::__cxx11::string::substr((ulong)&unparsed_value,(ulong)pbVar8);
          bVar4 = TypeConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  ::Convert(&unparsed_value,&parameter_value);
          ::std::__cxx11::string::~string((string *)&unparsed_value);
          if (!bVar4) {
            Log::Message(LT_ERROR,"Parser was added with invalid parameter \'%s\'.",
                         (pbVar8->_M_dataplus)._M_p);
            this = local_d0;
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&parameter_list);
            goto LAB_002ae135;
          }
        }
        iVar5 = parameter_value;
        ::std::__cxx11::string::substr((ulong)&unparsed_value,(ulong)pbVar8);
        piVar7 = robin_hood::detail::
                 Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                 ::doCreateByKey<std::__cxx11::string,int>
                           ((Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                             *)&new_parser.parameters,&unparsed_value);
        *piVar7 = iVar5;
        ::std::__cxx11::string::~string((string *)&unparsed_value);
        parameter_value = parameter_value + 1;
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&parameter_list);
      this = local_d0;
    }
    pPVar1 = (this->parsers).
             super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pPVar2 = (this->parsers).
             super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ::std::
    vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
    ::push_back(&this->parsers,&new_parser);
    if ((this->default_value).unit == UNKNOWN) {
      this_00 = &this->default_value;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      Variant::Get<std::__cxx11::string>(&unparsed_value,&this_00->value,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      iVar5 = (*(new_parser.parser)->_vptr_PropertyParser[2])
                        (new_parser.parser,this_00,&unparsed_value,&new_parser.parameters);
      if ((char)iVar5 == '\0') {
        Variant::operator=(&this_00->value,&unparsed_value);
        (this->default_value).unit = UNKNOWN;
      }
      else {
        (this->default_value).parser_index = (int)(((long)pPVar1 - (long)pPVar2) / 0x38);
      }
      ::std::__cxx11::string::~string((string *)&unparsed_value);
    }
  }
LAB_002ae135:
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&new_parser.parameters);
  return this;
}

Assistant:

PropertyDefinition& PropertyDefinition::AddParser(const String& parser_name, const String& parser_parameters)
{
	ParserState new_parser;

	// Fetch the parser.
	new_parser.parser = StyleSheetSpecification::GetParser(parser_name);
	if (new_parser.parser == nullptr)
	{
		Log::Message(Log::LT_ERROR, "Property was registered with invalid parser '%s'.", parser_name.c_str());
		return *this;
	}

	// Split the parameter list, and set up the map.
	if (!parser_parameters.empty())
	{
		StringList parameter_list;
		StringUtilities::ExpandString(parameter_list, parser_parameters);

		int parameter_value = 0;
		for (const String& parameter : parameter_list)
		{
			// Look for an optional parameter value such as in "normal=400".
			const size_t i_equal = parameter.find('=');
			if (i_equal != String::npos)
			{
				if (!TypeConverter<String, int>::Convert(parameter.substr(i_equal + 1), parameter_value))
				{
					Log::Message(Log::LT_ERROR, "Parser was added with invalid parameter '%s'.", parameter.c_str());
					return *this;
				}
			}

			new_parser.parameters[parameter.substr(0, i_equal)] = parameter_value;
			parameter_value += 1;
		}
	}

	const int parser_index = (int)parsers.size();
	parsers.push_back(new_parser);

	// If the default value has not been parsed successfully yet, run it through the new parser.
	if (default_value.unit == Unit::UNKNOWN)
	{
		String unparsed_value = default_value.value.Get<String>();
		if (new_parser.parser->ParseValue(default_value, unparsed_value, new_parser.parameters))
		{
			default_value.parser_index = parser_index;
		}
		else
		{
			default_value.value = unparsed_value;
			default_value.unit = Unit::UNKNOWN;
		}
	}

	return *this;
}